

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall
TasGrid::GridSequence::integrate(GridSequence *this,double *q,double *conformal_correction)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  reference pvVar4;
  double *pdVar5;
  int local_ac;
  int k_1;
  double *vals;
  int i_1;
  vector<double,_std::allocator<double>_> w_1;
  int k;
  int j;
  double *s;
  double w;
  int *p;
  undefined1 local_48 [4];
  int i;
  vector<double,_std::allocator<double>_> integ;
  int num_points;
  double *conformal_correction_local;
  double *q_local;
  GridSequence *this_local;
  
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::fill<double*,double>
            (q,q + (this->super_BaseCanonicalGrid).num_outputs,
             (double *)
             &integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (conformal_correction == (double *)0x0) {
    cacheBasisIntegrals((vector<double,_std::allocator<double>_> *)local_48,this);
    for (p._4_4_ = 0; p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
      piVar3 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,p._4_4_);
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,(long)*piVar3);
      s = (double *)*pvVar4;
      pdVar5 = Data2D<double>::getStrip(&this->surpluses,p._4_4_);
      for (w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ = 1;
          w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
          w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_48,
                            (long)piVar3[w_1.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
        s = (double *)(*pvVar4 * (double)s);
      }
      for (w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_ = 0;
          (int)w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage <
          (this->super_BaseCanonicalGrid).num_outputs;
          w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (int)w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        q[(int)w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage] =
             (double)s *
             pdVar5[(int)w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage] +
             q[(int)w_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage];
      }
    }
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_48);
  }
  else {
    ::std::allocator<double>::allocator((allocator<double> *)((long)&vals + 7));
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&i_1,(long)iVar2,
               (allocator<double> *)((long)&vals + 7));
    ::std::allocator<double>::~allocator((allocator<double> *)((long)&vals + 7));
    pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)&i_1);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xc])(this,pdVar5);
    for (vals._0_4_ = 0; (int)vals < iVar2; vals._0_4_ = (int)vals + 1) {
      dVar1 = conformal_correction[(int)vals];
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i_1,(long)(int)vals);
      *pvVar4 = *pvVar4 * dVar1;
      pdVar5 = StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,(int)vals);
      for (local_ac = 0; local_ac < (this->super_BaseCanonicalGrid).num_outputs;
          local_ac = local_ac + 1) {
        pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_1,(long)(int)vals);
        q[local_ac] = *pvVar4 * pdVar5[local_ac] + q[local_ac];
      }
    }
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&i_1);
  }
  return;
}

Assistant:

void GridSequence::integrate(double q[], double *conformal_correction) const{
    int num_points = points.getNumIndexes();
    std::fill(q, q + num_outputs, 0.0);

    // for sequence grids, quadrature weights are expensive,
    // if using simple integration use the basis integral + surpluses, which is fast
    // if using conformal map, then we have to compute the expensive weights
    if (conformal_correction == 0){
        std::vector<double> integ = cacheBasisIntegrals();
        for(int i=0; i<num_points; i++){
            const int* p = points.getIndex(i);
            double w = integ[p[0]];
            const double *s = surpluses.getStrip(i);
            for(int j=1; j<num_dimensions; j++){
                w *= integ[p[j]];
            }
            for(int k=0; k<num_outputs; k++){
                q[k] += w * s[k];
            }
        }
    }else{
        std::vector<double> w(num_points);
        getQuadratureWeights(w.data());
        for(int i=0; i<num_points; i++){
            w[i] *= conformal_correction[i];
            const double *vals = values.getValues(i);
            for(int k=0; k<num_outputs; k++){
                q[k] += w[i] * vals[k];
            }
        }
    }
}